

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Statement * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,IfStatement *i)

{
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Statement *pSVar5;
  IfStatement *pIVar6;
  pool_ptr<soul::AST::Constant> constant;
  long local_78;
  PackedData local_70;
  CompileMessage local_58;
  
  if (i->isConstIf == true) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&i->condition);
  }
  else {
    pIVar6 = (IfStatement *)
             ErrorIgnoringRewritingASTVisitor::visit
                       (&this->super_ErrorIgnoringRewritingASTVisitor,i);
    if (pIVar6 != i) {
      throwInternalCompilerError("std::addressof (result) == std::addressof (i)","visit",0x694);
    }
  }
  iVar4 = (*(((i->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                    (&local_78);
  pIVar6 = (IfStatement *)CONCAT44(extraout_var,iVar4);
  if (local_78 != 0) {
    soul::Value::getData(&local_70,(Value *)(local_78 + 0x30));
    bVar3 = soul::Value::PackedData::getAsBool(&local_70);
    if (bVar3) {
      pSVar5 = RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,(i->trueBranch).object);
      if ((i->trueBranch).object != pSVar5) {
        psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
                  itemsReplaced;
        *psVar1 = *psVar1 + 1;
        (i->trueBranch).object = pSVar5;
      }
      pIVar6 = (IfStatement *)(i->trueBranch).object;
    }
    else if ((i->falseBranch).object == (Statement *)0x0) {
      pIVar6 = (IfStatement *)
               PoolAllocator::allocate<soul::AST::NoopStatement,soul::AST::Context&>
                         (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                          &(i->super_Statement).super_ASTObject.context);
    }
    else {
      RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->falseBranch);
      pIVar6 = (IfStatement *)(i->falseBranch).object;
      if (pIVar6 == (IfStatement *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
    }
  }
  if ((local_78 == 0) && (pIVar6 = i, i->isConstIf == true)) {
    if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
      pEVar2 = (i->condition).object;
      CompileMessageHelpers::createMessage<>(&local_58,syntax,error,"Expected a constant value");
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_58,false);
    }
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  return &pIVar6->super_Statement;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);
            }
            else
            {
                auto& result = super::visit (i);
                SOUL_ASSERT (std::addressof (result) == std::addressof (i));
            }

            if (auto constant = i.condition->getAsConstant())
            {
                if (constant->value.getAsBool())
                {
                    replaceStatement (i.trueBranch);
                    return i.trueBranch;
                }

                if (i.falseBranch != nullptr)
                {
                    replaceStatement (i.falseBranch);
                    return *i.falseBranch;
                }

                return allocator.allocate<AST::NoopStatement> (i.context);
            }

            if (i.isConstIf)
            {
                if (! ignoreErrors)
                    i.condition->context.throwError (Errors::expectedConstant());
                else
                    ++numFails;
            }

            return i;
        }